

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O1

Vec_Int_t * Sdb_StoFindAll(Vec_Wec_t *vCuts)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *p;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  if (0 < vCuts->nSize) {
    lVar5 = 0;
    do {
      pVVar1 = vCuts->pArray;
      if (0 < pVVar1[lVar5].nSize) {
        lVar4 = 0;
        do {
          if (0 < (long)p->nSize) {
            lVar3 = 0;
            do {
              if (p->pArray[lVar3] == pVVar1[lVar5].pArray[lVar4]) goto LAB_00681c74;
              lVar3 = lVar3 + 1;
            } while (p->nSize != lVar3);
          }
          Vec_IntPush(p,pVVar1[lVar5].pArray[lVar4]);
LAB_00681c74:
          lVar4 = lVar4 + 1;
        } while (lVar4 < pVVar1[lVar5].nSize);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vCuts->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Sdb_StoFindAll( Vec_Wec_t * vCuts )
{
    int i, k, Entry;
    Vec_Int_t * vCut, * vAll = Vec_IntAlloc( 100 );  
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntPushUnique( vAll, Entry );
    return vAll;
}